

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void aom_highbd_filter_block1d8_v2_avx2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  undefined1 auVar1 [16];
  long in_RCX;
  uint16_t *in_RDX;
  ptrdiff_t in_RSI;
  uint16_t *in_RDI;
  int in_R8D;
  int16_t *in_R9;
  byte in_stack_00000008;
  __m128i ff;
  __m128i max;
  __m128i res1;
  __m128i res0;
  __m128i signal [3];
  longlong local_d8 [2];
  longlong local_c8;
  longlong lStack_c0;
  longlong local_b8 [2];
  longlong local_a8 [2];
  longlong local_98 [8];
  int local_54;
  long local_50;
  uint16_t *local_48;
  ptrdiff_t local_40;
  uint16_t *local_38;
  ushort local_2a;
  undefined1 local_28 [16];
  ushort local_10;
  ushort local_e;
  ushort local_c;
  ushort local_a;
  ushort local_8;
  ushort local_6;
  ushort local_4;
  ushort local_2;
  
  local_2a = (short)(1 << (in_stack_00000008 & 0x1f)) - 1;
  auVar1 = vpinsrw_avx(ZEXT216(local_2a),(uint)local_2a,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)local_2a,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)local_2a,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)local_2a,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)local_2a,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)local_2a,6);
  local_28 = vpinsrw_avx(auVar1,(uint)local_2a,7);
  local_c8 = local_28._0_8_;
  lStack_c0 = local_28._8_8_;
  local_54 = in_R8D;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  local_10 = local_2a;
  local_e = local_2a;
  local_c = local_2a;
  local_a = local_2a;
  local_8 = local_2a;
  local_6 = local_2a;
  local_4 = local_2a;
  local_2 = local_2a;
  pack_8x1_2t_filter(in_R9,&local_d8);
  pack_8x2_init(local_38,(__m128i *)local_98);
  do {
    pack_8x2_2t_pixels_ver(local_38,local_40,(__m128i *)local_98);
    filter_8_2t_pixels((__m128i *)local_98,&local_d8,&local_a8,&local_b8);
    store_8x1_2t_pixels_ver(&local_a8,&local_b8,(__m128i *)&local_c8,local_48);
    local_38 = local_38 + local_40;
    local_48 = local_48 + local_50;
    local_54 = local_54 + -1;
  } while (local_54 != 0);
  return;
}

Assistant:

static void aom_highbd_filter_block1d8_v2_avx2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  __m128i signal[3], res0, res1;
  const __m128i max = _mm_set1_epi16((1 << bd) - 1);
  __m128i ff;

  pack_8x1_2t_filter(filter, &ff);
  pack_8x2_init(src_ptr, signal);

  do {
    pack_8x2_2t_pixels_ver(src_ptr, src_pitch, signal);
    filter_8_2t_pixels(signal, &ff, &res0, &res1);
    store_8x1_2t_pixels_ver(&res0, &res1, &max, dst_ptr);

    src_ptr += src_pitch;
    dst_ptr += dst_pitch;
    height -= 1;
  } while (height > 0);
}